

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O2

X509 * X509_find_by_issuer_and_serial(stack_st_X509 *sk,X509_NAME *name,ASN1_INTEGER *serial)

{
  int iVar1;
  size_t sVar2;
  X509 *pXVar3;
  size_t i;
  ulong i_00;
  
  if ((serial->type | 0x100U) == 0x102) {
    for (i_00 = 0; sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)sk), i_00 < sVar2; i_00 = i_00 + 1) {
      pXVar3 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)sk,i_00);
      iVar1 = ASN1_INTEGER_cmp(pXVar3->cert_info->serialNumber,serial);
      if ((iVar1 == 0) && (iVar1 = X509_NAME_cmp(pXVar3->cert_info->issuer,name), iVar1 == 0)) {
        return pXVar3;
      }
    }
  }
  return (X509 *)0x0;
}

Assistant:

X509 *X509_find_by_issuer_and_serial(const STACK_OF(X509) *sk, X509_NAME *name,
                                     const ASN1_INTEGER *serial) {
  if (serial->type != V_ASN1_INTEGER && serial->type != V_ASN1_NEG_INTEGER) {
    return NULL;
  }

  for (size_t i = 0; i < sk_X509_num(sk); i++) {
    X509 *x509 = sk_X509_value(sk, i);
    if (ASN1_INTEGER_cmp(X509_get0_serialNumber(x509), serial) == 0 &&
        X509_NAME_cmp(X509_get_issuer_name(x509), name) == 0) {
      return x509;
    }
  }
  return NULL;
}